

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall icu_63::DateFormatSymbols::initZoneStringsArray(DateFormatSymbols *this)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  StringEnumeration *pSVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  void *p;
  UnicodeString *this_00;
  UnicodeString *local_f8;
  UnicodeString *local_e8;
  int local_c8;
  int32_t i_1;
  undefined1 local_90 [8];
  UnicodeString tzDispName;
  UDate now;
  int32_t i;
  UnicodeString *tzid;
  int32_t size;
  int32_t rows;
  TimeZoneNames *tzNames;
  UnicodeString **zarray;
  StringEnumeration *tzids;
  DateFormatSymbols *pDStack_10;
  UErrorCode status;
  DateFormatSymbols *this_local;
  UnicodeString *pUVar5;
  
  if ((this->fZoneStrings == (UnicodeString **)0x0) &&
     (this->fLocaleZoneStrings == (UnicodeString **)0x0)) {
    tzids._4_4_ = U_ZERO_ERROR;
    tzNames = (TimeZoneNames *)0x0;
    _size = (TimeZoneNames *)0x0;
    pDStack_10 = this;
    pSVar4 = TimeZone::createTimeZoneIDEnumeration
                       (UCAL_ZONE_TYPE_ANY,(char *)0x0,(int32_t *)0x0,
                        (UErrorCode *)((long)&tzids + 4));
    p = (void *)((long)&tzids + 4);
    iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[4])();
    UVar1 = ::U_FAILURE(tzids._4_4_);
    if (UVar1 == '\0') {
      tzNames = (TimeZoneNames *)uprv_malloc_63((long)(iVar2 << 3));
      if (tzNames == (TimeZoneNames *)0x0) {
        tzids._4_4_ = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        memset(tzNames,0,(long)(iVar2 << 3));
        _size = TimeZoneNames::createInstance(&this->fZSFLocale,(UErrorCode *)((long)&tzids + 4));
        p = (void *)((long)&tzids + 4);
        (*(_size->super_UObject)._vptr_UObject[0xd])();
        UVar1 = ::U_FAILURE(tzids._4_4_);
        if (UVar1 == '\0') {
          now._4_4_ = 0;
          tzDispName.fUnion._48_8_ = Calendar::getNow();
          icu_63::UnicodeString::UnicodeString((UnicodeString *)local_90);
          while( true ) {
            p = (void *)((long)&tzids + 4);
            iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])();
            pUVar5 = (UnicodeString *)CONCAT44(extraout_var,iVar3);
            if ((pUVar5 == (UnicodeString *)0x0) ||
               (UVar1 = ::U_FAILURE(tzids._4_4_), UVar1 != '\0')) goto LAB_003a015d;
            puVar6 = (undefined8 *)UMemory::operator_new__((UMemory *)0x148,(size_t)p);
            local_e8 = (UnicodeString *)0x0;
            if (puVar6 != (undefined8 *)0x0) {
              *puVar6 = 5;
              local_e8 = (UnicodeString *)(puVar6 + 1);
              local_f8 = local_e8;
              do {
                icu_63::UnicodeString::UnicodeString(local_f8);
                local_f8 = local_f8 + 1;
              } while (local_f8 != (UnicodeString *)(puVar6 + 0x29));
            }
            tzNames[now._4_4_].super_UObject._vptr_UObject = (_func_int **)local_e8;
            if (tzNames[now._4_4_].super_UObject._vptr_UObject == (_func_int **)0x0) break;
            icu_63::UnicodeString::setTo
                      ((UnicodeString *)tzNames[now._4_4_].super_UObject._vptr_UObject,pUVar5);
            (*(_size->super_UObject)._vptr_UObject[0xe])
                      (tzDispName.fUnion._48_8_,_size,pUVar5,initZoneStringsArray::TYPES,4,
                       tzNames[now._4_4_].super_UObject._vptr_UObject + 8,(long)&tzids + 4);
            now._4_4_ = now._4_4_ + 1;
          }
          tzids._4_4_ = U_MEMORY_ALLOCATION_ERROR;
LAB_003a015d:
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_90);
        }
      }
    }
    UVar1 = ::U_FAILURE(tzids._4_4_);
    if ((UVar1 != '\0') && (tzNames != (TimeZoneNames *)0x0)) {
      for (local_c8 = 0; local_c8 < iVar2; local_c8 = local_c8 + 1) {
        if ((tzNames[local_c8].super_UObject._vptr_UObject != (_func_int **)0x0) &&
           (pUVar5 = (UnicodeString *)tzNames[local_c8].super_UObject._vptr_UObject,
           pUVar5 != (UnicodeString *)0x0)) {
          this_00 = pUVar5 + *(long *)((long)&pUVar5[-1].fUnion + 0x30);
          while (pUVar5 != this_00) {
            this_00 = this_00 + -1;
            icu_63::UnicodeString::~UnicodeString(this_00);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar5[-1].fUnion + 0x30),p);
        }
      }
      uprv_free_63(tzNames);
      tzNames = (TimeZoneNames *)0x0;
    }
    if ((_size != (TimeZoneNames *)0x0) && (_size != (TimeZoneNames *)0x0)) {
      (*(_size->super_UObject)._vptr_UObject[1])();
    }
    if ((pSVar4 != (StringEnumeration *)0x0) && (pSVar4 != (StringEnumeration *)0x0)) {
      (*(pSVar4->super_UObject)._vptr_UObject[1])();
    }
    this->fLocaleZoneStrings = (UnicodeString **)tzNames;
    this->fZoneStringsRowCount = iVar2;
    this->fZoneStringsColCount = 5;
  }
  return;
}

Assistant:

void
DateFormatSymbols::initZoneStringsArray(void) {
    if (fZoneStrings != NULL || fLocaleZoneStrings != NULL) {
        return;
    }

    UErrorCode status = U_ZERO_ERROR;

    StringEnumeration *tzids = NULL;
    UnicodeString ** zarray = NULL;
    TimeZoneNames *tzNames = NULL;
    int32_t rows = 0;

    static const UTimeZoneNameType TYPES[] = {
        UTZNM_LONG_STANDARD, UTZNM_SHORT_STANDARD,
        UTZNM_LONG_DAYLIGHT, UTZNM_SHORT_DAYLIGHT
    };
    static const int32_t NUM_TYPES = 4;

    do { // dummy do-while

        tzids = TimeZone::createTimeZoneIDEnumeration(ZONE_SET, NULL, NULL, status);
        rows = tzids->count(status);
        if (U_FAILURE(status)) {
            break;
        }

        // Allocate array
        int32_t size = rows * sizeof(UnicodeString*);
        zarray = (UnicodeString**)uprv_malloc(size);
        if (zarray == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            break;
        }
        uprv_memset(zarray, 0, size);

        tzNames = TimeZoneNames::createInstance(fZSFLocale, status);
        tzNames->loadAllDisplayNames(status);
        if (U_FAILURE(status)) { break; }

        const UnicodeString *tzid;
        int32_t i = 0;
        UDate now = Calendar::getNow();
        UnicodeString tzDispName;

        while ((tzid = tzids->snext(status)) != 0) {
            if (U_FAILURE(status)) {
                break;
            }

            zarray[i] = new UnicodeString[5];
            if (zarray[i] == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

            zarray[i][0].setTo(*tzid);
            tzNames->getDisplayNames(*tzid, TYPES, NUM_TYPES, now, zarray[i]+1, status);
            i++;
        }

    } while (FALSE);

    if (U_FAILURE(status)) {
        if (zarray) {
            for (int32_t i = 0; i < rows; i++) {
                if (zarray[i]) {
                    delete[] zarray[i];
                }
            }
            uprv_free(zarray);
            zarray = NULL;
        }
    }

    if (tzNames) {
        delete tzNames;
    }
    if (tzids) {
        delete tzids;
    }

    fLocaleZoneStrings = zarray;
    fZoneStringsRowCount = rows;
    fZoneStringsColCount = 1 + NUM_TYPES;
}